

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus genxStartDocFile(genxWriter w,FILE *file)

{
  FILE *file_local;
  genxWriter w_local;
  genxStatus local_4;
  
  if (w->sequence == SEQUENCE_NO_DOC) {
    w->sequence = SEQUENCE_PRE_DOC;
    w->file = file;
    w->sender = (genxSender *)0x0;
    local_4 = GENX_SUCCESS;
  }
  else {
    w->status = GENX_SEQUENCE_ERROR;
    local_4 = GENX_SEQUENCE_ERROR;
  }
  return local_4;
}

Assistant:

genxStatus genxStartDocFile(genxWriter w, FILE * file)
{
  if (w->sequence != SEQUENCE_NO_DOC)
    return w->status = GENX_SEQUENCE_ERROR;
  
  w->sequence = SEQUENCE_PRE_DOC;
  w->file = file;
  w->sender = NULL;
  return GENX_SUCCESS;
}